

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorCvode.H
# Opt level: O0

void __thiscall pele::physics::reactions::ReactorCvode::ReactorCvode(ReactorCvode *this)

{
  Register<pele::physics::reactions::ReactorCvode> *in_RDI;
  
  Factory<pele::physics::reactions::ReactorBase>::Register<pele::physics::reactions::ReactorCvode>::
  Register(in_RDI);
  (in_RDI->super_ReactorBase).super_Factory<pele::physics::reactions::ReactorBase>._vptr_Factory =
       (_func_int **)&PTR__ReactorCvode_018012d0;
  in_RDI[1].super_ReactorBase.super_Factory<pele::physics::reactions::ReactorBase>._vptr_Factory =
       (_func_int **)0x3eb0c6f7a0b5ed8d;
  *(undefined8 *)&in_RDI[1].super_ReactorBase.verbose = 0x3ddb7cdfd9d7bdbb;
  *(undefined4 *)((long)in_RDI[1].super_ReactorBase.m_typ_vals._M_elems + 4) = 0;
  *(undefined4 *)(in_RDI[1].super_ReactorBase.m_typ_vals._M_elems + 1) = 1;
  *(undefined4 *)((long)in_RDI[1].super_ReactorBase.m_typ_vals._M_elems + 0xc) = 3;
  *(undefined4 *)(in_RDI[1].super_ReactorBase.m_typ_vals._M_elems + 2) = 2;
  *(undefined1 *)((long)in_RDI[1].super_ReactorBase.m_typ_vals._M_elems + 0x14) = 0;
  in_RDI[1].super_ReactorBase.m_typ_vals._M_elems[3] = 0.0;
  in_RDI[1].super_ReactorBase.m_typ_vals._M_elems[4] = 0.0;
  in_RDI[1].super_ReactorBase.m_typ_vals._M_elems[5] = 0.0;
  in_RDI[1].super_ReactorBase.m_typ_vals._M_elems[6] = 0.0;
  in_RDI[1].super_ReactorBase.m_typ_vals._M_elems[7] = 0.0;
  in_RDI[1].super_ReactorBase.m_typ_vals._M_elems[8] = 0.0;
  return;
}

Assistant:

static std::string identifier() { return "ReactorCvode"; }